

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::vertexAttribPointer
          (ReferenceContext *this,deUint32 index,int rawSize,deUint32 type,deBool normalized,
          int stride,void *pointer)

{
  int *piVar1;
  VertexArray *pVVar2;
  pointer pVVar3;
  DataBuffer *pDVar4;
  int iVar5;
  VertexArray *pVVar6;
  bool bVar7;
  bool bVar8;
  
  bVar7 = ((this->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0;
  bVar8 = rawSize != 0x80e1;
  iVar5 = 4;
  if (bVar8 || bVar7) {
    iVar5 = rawSize;
  }
  if ((index < (uint)(this->m_limits).maxVertexAttribs) && (0xfffffffb < iVar5 - 5U)) {
    if ((((0xc < type - 0x1400) || ((0x1c7fU >> (type - 0x1400 & 0x1f) & 1) == 0)) &&
        ((type != 0x8368 && (type != 0x8d9f)))) || (1 < (uint)normalized)) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    if (-1 < stride) {
      if (((((type != 0x8d9f && type != 0x8368) || (iVar5 == 4)) &&
           ((pVVar2 = this->m_vertexArrayBinding, pVVar2 == (VertexArray *)0x0 ||
            ((pointer == (void *)0x0 || (this->m_arrayBufferBinding != (DataBuffer *)0x0)))))) &&
          (((type == 0x1401 || type == 0x8d9f) || type == 0x8368) || (bVar8 || bVar7))) &&
         ((bVar8 || bVar7) || normalized != 0)) {
        pVVar6 = &this->m_clientVertexArray;
        if (pVVar2 != (VertexArray *)0x0) {
          pVVar6 = pVVar2;
        }
        pVVar3 = (pVVar6->m_arrays).
                 super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar3[index].size = rawSize;
        pVVar3[index].stride = stride;
        pVVar3[index].type = type;
        pVVar3[index].normalized = normalized == 1;
        pVVar3[index].integer = false;
        pVVar3[index].pointer = pointer;
        pDVar4 = this->m_arrayBufferBinding;
        if (pDVar4 != (DataBuffer *)0x0) {
          piVar1 = &(pDVar4->super_NamedObject).m_refCount;
          *piVar1 = *piVar1 + 1;
        }
        if (pVVar3[index].bufferBinding != (DataBuffer *)0x0) {
          rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference
                    (&this->m_buffers,pVVar3[index].bufferBinding);
          pVVar3 = (pVVar6->m_arrays).
                   super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pDVar4 = this->m_arrayBufferBinding;
        }
        pVVar3[index].bufferDeleted = false;
        pVVar3[index].bufferBinding = pDVar4;
        return;
      }
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x502;
      return;
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::vertexAttribPointer (deUint32 index, int rawSize, deUint32 type, deBool normalized, int stride, const void *pointer)
{
	const bool allowBGRA	= !glu::isContextTypeES(getType());
	const int effectiveSize	= (allowBGRA && rawSize == GL_BGRA) ? (4) : (rawSize);

	RC_IF_ERROR(index >= (deUint32)m_limits.maxVertexAttribs, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(effectiveSize <= 0 || effectiveSize > 4, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(type != GL_BYTE					&&	type != GL_UNSIGNED_BYTE	&&
				type != GL_SHORT				&&	type != GL_UNSIGNED_SHORT	&&
				type != GL_INT					&&	type != GL_UNSIGNED_INT		&&
				type != GL_FIXED				&&	type != GL_DOUBLE			&&
				type != GL_FLOAT				&&	type != GL_HALF_FLOAT		&&
				type != GL_INT_2_10_10_10_REV	&&	type != GL_UNSIGNED_INT_2_10_10_10_REV, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(normalized != GL_TRUE && normalized != GL_FALSE, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(stride < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR((type == GL_INT_2_10_10_10_REV || type == GL_UNSIGNED_INT_2_10_10_10_REV) && effectiveSize != 4, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(m_vertexArrayBinding != DE_NULL && m_arrayBufferBinding == DE_NULL && pointer != DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(allowBGRA && rawSize == GL_BGRA && type != GL_INT_2_10_10_10_REV && type != GL_UNSIGNED_INT_2_10_10_10_REV && type != GL_UNSIGNED_BYTE, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(allowBGRA && rawSize == GL_BGRA && normalized == GL_FALSE, GL_INVALID_OPERATION, RC_RET_VOID);

	rc::VertexArray& vao = (m_vertexArrayBinding) ? (*m_vertexArrayBinding) : (m_clientVertexArray);

	vao.m_arrays[index].size			= rawSize;
	vao.m_arrays[index].stride			= stride;
	vao.m_arrays[index].type			= type;
	vao.m_arrays[index].normalized		= normalized == GL_TRUE;
	vao.m_arrays[index].integer			= false;
	vao.m_arrays[index].pointer			= pointer;

	// acquire new reference
	if (m_arrayBufferBinding)
		m_buffers.acquireReference(m_arrayBufferBinding);

	// release old reference
	if (vao.m_arrays[index].bufferBinding)
		m_buffers.releaseReference(vao.m_arrays[index].bufferBinding);

	vao.m_arrays[index].bufferDeleted	= false;
	vao.m_arrays[index].bufferBinding	= m_arrayBufferBinding;
}